

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

double __thiscall crnlib::random::gaussian(random *this,double mean,double stddev)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double __x;
  
  do {
    do {
      dVar3 = drand(this,0.0,1.0);
      dVar4 = drand(this,0.0,1.0);
      bVar1 = 0.0 < dVar3;
      bVar2 = 0.0 < dVar4;
      __x = 1.0;
      if (bVar2 && bVar1) {
        __x = dVar3;
      }
      dVar4 = (dVar4 + -0.5) * 1.7156;
      dVar3 = 0.8578;
      if (bVar2 && bVar1) {
        dVar3 = dVar4;
      }
      dVar5 = __x + -0.449871;
      dVar6 = 1.244395;
      if (bVar2 && bVar1) {
        dVar6 = ABS(dVar4) + 0.386595;
      }
      dVar4 = dVar5 * dVar5 + (dVar6 * 0.196 + dVar5 * -0.25472) * dVar6;
      if (dVar4 < 0.27597) goto LAB_00134265;
    } while (0.27846 < dVar4);
    dVar4 = log(__x);
  } while (dVar4 * -4.0 * __x * __x < dVar3 * dVar3);
LAB_00134265:
  return (dVar3 * stddev) / __x + mean;
}

Assistant:

double random::gaussian(double mean, double stddev)
    {
        double q, u, v, x, y;

        /*
            Generate P = (u,v) uniform in rect. enclosing acceptance region
            Make sure that any random numbers <= 0 are rejected, since
            gaussian() requires uniforms > 0, but RandomUniform() delivers >= 0.
            */
        do
        {
            u = drand(0, 1);
            v = drand(0, 1);
            if (u <= 0.0 || v <= 0.0)
            {
                u = 1.0;
                v = 1.0;
            }
            v = 1.7156 * (v - 0.5);

            /*  Evaluate the quadratic form */
            x = u - 0.449871;
            y = fabs(v) + 0.386595;
            q = x * x + y * (0.19600 * y - 0.25472 * x);

            /* Accept P if inside inner ellipse */
            if (q < 0.27597)
            {
                break;
            }

            /*  Reject P if outside outer ellipse, or outside acceptance region */
        } while ((q > 0.27846) || (v * v > -4.0 * log(u) * u * u));

        /*  Return ratio of P's coordinates as the normal deviate */
        return (mean + stddev * v / u);
    }